

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

void P_DeathThink(player_t *player)

{
  uint uVar1;
  DBot *pDVar2;
  PClass *pPVar3;
  byte bVar4;
  int iVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  APlayerPawn *pAVar7;
  AActor *pAVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  DAngle local_20;
  
  player_t::TickPSprites(player);
  pAVar7 = player->mo;
  player->onground = (pAVar7->super_AActor).__Pos.Z <= (pAVar7->super_AActor).floorz;
  pPVar3 = APlayerChunk::RegistrationInfo.MyClass;
  if ((pAVar7->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
    iVar5 = (**(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar7);
    (pAVar7->super_AActor).super_DThinker.super_DObject.Class =
         (PClass *)CONCAT44(extraout_var,iVar5);
  }
  pPVar6 = (pAVar7->super_AActor).super_DThinker.super_DObject.Class;
  bVar9 = pPVar6 != (PClass *)0x0;
  if (pPVar6 != pPVar3 && bVar9) {
    do {
      pPVar6 = pPVar6->ParentClass;
      bVar9 = pPVar6 != (PClass *)0x0;
      if (pPVar6 == pPVar3) break;
    } while (pPVar6 != (PClass *)0x0);
  }
  if (bVar9) {
    player->viewheight = 6.0;
    player->deltaviewheight = 0.0;
    if (player->onground == true) {
      dVar11 = (player->mo->super_AActor).Angles.Pitch.Degrees;
      if (-19.0 < dVar11) {
        (player->mo->super_AActor).Angles.Pitch.Degrees = (-19.0 - dVar11) * 0.125 + dVar11;
      }
    }
  }
  else {
    pAVar7 = player->mo;
    if (-1 < (int)(pAVar7->super_AActor).flags.Value) {
      player->deltaviewheight = 0.0;
      if (6.0 < player->viewheight) {
        player->viewheight = player->viewheight + -1.0;
      }
      if (player->viewheight <= 6.0 && player->viewheight != 6.0) {
        player->viewheight = 6.0;
      }
      dVar11 = (pAVar7->super_AActor).Angles.Pitch.Degrees;
      if (0.0 <= dVar11) {
        if (0.0 < dVar11) {
          dVar10 = -3.0;
          goto LAB_0046b09d;
        }
      }
      else {
        dVar10 = 3.0;
LAB_0046b09d:
        (pAVar7->super_AActor).Angles.Pitch.Degrees = dVar11 + dVar10;
      }
      if (ABS((pAVar7->super_AActor).Angles.Pitch.Degrees) < 3.0) {
        (pAVar7->super_AActor).Angles.Pitch.Degrees = 0.0;
      }
    }
  }
  P_CalcHeight(player);
  pAVar8 = (player->attacker).field_0.p;
  if (pAVar8 != (AActor *)0x0) {
    if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      pAVar7 = (APlayerPawn *)(player->attacker).field_0.p;
      if ((pAVar7 != (APlayerPawn *)0x0) &&
         (((pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
        (player->attacker).field_0.p = (AActor *)0x0;
        pAVar7 = (APlayerPawn *)0x0;
      }
      if (pAVar7 != player->mo) {
        pAVar8 = (player->attacker).field_0.p;
        if ((pAVar8 != (AActor *)0x0) &&
           (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (player->attacker).field_0.p = (AActor *)0x0;
          pAVar8 = (AActor *)0x0;
        }
        iVar5 = P_FaceMobj(&player->mo->super_AActor,pAVar8,&local_20);
        if (local_20.Degrees < 10.0) {
          if (player->damagecount != 0) {
            player->damagecount = player->damagecount + -1;
          }
          if (player->poisoncount != 0) {
            player->poisoncount = player->poisoncount + -1;
          }
        }
        dVar11 = 5.0;
        if (local_20.Degrees * 0.125 <= 5.0) {
          dVar11 = local_20.Degrees * 0.125;
        }
        pAVar7 = player->mo;
        dVar10 = (pAVar7->super_AActor).Angles.Yaw.Degrees;
        if (iVar5 == 0) {
          (pAVar7->super_AActor).Angles.Yaw.Degrees = dVar10 - dVar11;
        }
        else {
          (pAVar7->super_AActor).Angles.Yaw.Degrees = dVar11 + dVar10;
        }
        goto LAB_0046b1ec;
      }
    }
    else {
      (player->attacker).field_0.p = (AActor *)0x0;
    }
  }
  if (player->damagecount != 0) {
    player->damagecount = player->damagecount + -1;
  }
  if (player->poisoncount != 0) {
    player->poisoncount = player->poisoncount + -1;
  }
LAB_0046b1ec:
  uVar1 = (player->cmd).ucmd.buttons;
  if ((((uVar1 & 2) != 0) ||
      (((multiplayer != false || (alwaysapplydmflags.Value == true)) &&
       ((dmflags.Value._1_1_ & 1) != 0)))) && ((dmflags2.Value._1_1_ & 0x40) == 0)) {
    if (level.time < player->respawn_time) {
      if ((uVar1 & 2) == 0) {
        return;
      }
      pDVar2 = (player->Bot).field_0.p;
      if (pDVar2 != (DBot *)0x0) {
        if (((pDVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          return;
        }
        (player->Bot).field_0.p = (DBot *)0x0;
      }
    }
    player->cls = (PClassPlayerPawn *)0x0;
    bVar4 = 2;
    if ((multiplayer == false) && ((level.flags2._2_1_ & 2) == 0)) {
      bVar4 = sv_singleplayerrespawn.Value ^ 3;
    }
    player->playerstate = bVar4;
    if (2 < (player->mo->super_AActor).special1) {
      (player->mo->super_AActor).special1 = 0;
    }
  }
  return;
}

Assistant:

void P_DeathThink (player_t *player)
{
	int dir;
	DAngle delta;

	player->TickPSprites();

	player->onground = (player->mo->Z() <= player->mo->floorz);
	if (player->mo->IsKindOf (RUNTIME_CLASS(APlayerChunk)))
	{ // Flying bloody skull or flying ice chunk
		player->viewheight = 6;
		player->deltaviewheight = 0;
		if (player->onground)
		{
			if (player->mo->Angles.Pitch > -19.)
			{
				DAngle lookDelta = (-19. - player->mo->Angles.Pitch) / 8;
				player->mo->Angles.Pitch += lookDelta;
			}
		}
	}
	else if (!(player->mo->flags & MF_ICECORPSE))
	{ // Fall to ground (if not frozen)
		player->deltaviewheight = 0;
		if (player->viewheight > 6)
		{
			player->viewheight -= 1;
		}
		if (player->viewheight < 6)
		{
			player->viewheight = 6;
		}
		if (player->mo->Angles.Pitch < 0)
		{
			player->mo->Angles.Pitch += 3;
		}
		else if (player->mo->Angles.Pitch > 0)
		{
			player->mo->Angles.Pitch -= 3;
		}
		if (fabs(player->mo->Angles.Pitch) < 3)
		{
			player->mo->Angles.Pitch = 0.;
		}
	}
	P_CalcHeight (player);
		
	if (player->attacker && player->attacker != player->mo)
	{ // Watch killer
		dir = P_FaceMobj (player->mo, player->attacker, &delta);
		if (delta < 10)
		{ // Looking at killer, so fade damage and poison counters
			if (player->damagecount)
			{
				player->damagecount--;
			}
			if (player->poisoncount)
			{
				player->poisoncount--;
			}
		}
		delta /= 8;
		if (delta > 5.)
		{
			delta = 5.;
		}
		if (dir)
		{ // Turn clockwise
			player->mo->Angles.Yaw += delta;
		}
		else
		{ // Turn counter clockwise
			player->mo->Angles.Yaw -= delta;
		}
	}
	else
	{
		if (player->damagecount)
		{
			player->damagecount--;
		}
		if (player->poisoncount)
		{
			player->poisoncount--;
		}
	}		

	if ((player->cmd.ucmd.buttons & BT_USE ||
		((multiplayer || alwaysapplydmflags) && (dmflags & DF_FORCE_RESPAWN))) && !(dmflags2 & DF2_NO_RESPAWN))
	{
		if (level.time >= player->respawn_time || ((player->cmd.ucmd.buttons & BT_USE) && player->Bot == NULL))
		{
			player->cls = NULL;		// Force a new class if the player is using a random class
			player->playerstate = 
				(multiplayer || (level.flags2 & LEVEL2_ALLOWRESPAWN) || sv_singleplayerrespawn)
				? PST_REBORN : PST_ENTER;
			if (player->mo->special1 > 2)
			{
				player->mo->special1 = 0;
			}
		}
	}
}